

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

string * __thiscall
CFG::vecToStr(string *__return_storage_ptr__,CFG *this,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *strVec)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> el;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_78;
  long local_70;
  long local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pbVar3 = (strVec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (strVec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,pcVar2 + pbVar3->_M_string_length);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_78,local_70 + (long)local_78);
      std::__cxx11::string::append((char *)local_50);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CFG::vecToStr(const std::vector<std::string> &strVec) const {
    std::string output = "";
    for (auto el: strVec) {
        output += el + ", ";
    }
    if (output.size() != 0) {
        output = output.substr(0, output.size() - 2);
    }
    return output;
}